

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O1

double __thiscall Imath_2_5::Matrix44<double>::determinant(Matrix44<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = this->x[0][3];
  dVar8 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar8 = this->x[2][0];
    dVar2 = this->x[2][1];
    dVar3 = this->x[3][2];
    dVar4 = this->x[2][2];
    dVar5 = this->x[3][1];
    dVar6 = this->x[3][0];
    dVar8 = 0.0 - dVar1 * ((dVar8 * dVar5 - dVar6 * dVar2) * this->x[1][2] +
                          (dVar2 * dVar3 - dVar5 * dVar4) * this->x[1][0] +
                          (dVar4 * dVar6 - dVar3 * dVar8) * this->x[1][1]);
  }
  dVar1 = this->x[1][3];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = this->x[2][0];
    dVar3 = this->x[2][1];
    dVar4 = this->x[3][2];
    dVar5 = this->x[2][2];
    dVar6 = this->x[3][1];
    dVar7 = this->x[3][0];
    dVar8 = dVar8 + dVar1 * ((dVar2 * dVar6 - dVar7 * dVar3) * this->x[0][2] +
                            (dVar3 * dVar4 - dVar6 * dVar5) * this->x[0][0] +
                            (dVar5 * dVar7 - dVar4 * dVar2) * this->x[0][1]);
  }
  dVar1 = this->x[2][3];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = this->x[1][0];
    dVar3 = this->x[1][1];
    dVar4 = this->x[3][2];
    dVar5 = this->x[1][2];
    dVar6 = this->x[3][1];
    dVar7 = this->x[3][0];
    dVar8 = dVar8 - dVar1 * ((dVar2 * dVar6 - dVar7 * dVar3) * this->x[0][2] +
                            (dVar3 * dVar4 - dVar6 * dVar5) * this->x[0][0] +
                            (dVar5 * dVar7 - dVar4 * dVar2) * this->x[0][1]);
  }
  dVar1 = this->x[3][3];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = this->x[1][0];
    dVar3 = this->x[1][1];
    dVar4 = this->x[2][2];
    dVar5 = this->x[1][2];
    dVar6 = this->x[2][1];
    dVar7 = this->x[2][0];
    dVar8 = dVar1 * ((dVar2 * dVar6 - dVar7 * dVar3) * this->x[0][2] +
                    (dVar3 * dVar4 - dVar6 * dVar5) * this->x[0][0] +
                    (dVar5 * dVar7 - dVar4 * dVar2) * this->x[0][1]) + dVar8;
  }
  return dVar8;
}

Assistant:

inline T
Matrix44<T>::determinant () const
{
    T sum = (T)0;

    if (x[0][3] != 0.) sum -= x[0][3] * fastMinor(1,2,3,0,1,2);
    if (x[1][3] != 0.) sum += x[1][3] * fastMinor(0,2,3,0,1,2);
    if (x[2][3] != 0.) sum -= x[2][3] * fastMinor(0,1,3,0,1,2);
    if (x[3][3] != 0.) sum += x[3][3] * fastMinor(0,1,2,0,1,2);

    return sum;
}